

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O0

void benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke
               (BenchmarkContext *context,int64_t numSlots)

{
  int64_t iVar1;
  __sighandler_t __handler;
  int __sig;
  long local_d0;
  int64_t i;
  string local_c0 [32];
  undefined1 local_a0 [8];
  IOperationProfilerPtr op;
  undefined1 local_80 [8];
  StorageArray<boost::signals2::scoped_connection> c;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58 [8];
  SignalType s;
  HandlerType handler;
  int64_t n;
  int64_t numSlots_local;
  BenchmarkContext *context_local;
  
  iVar1 = BenchmarkContext::GetIterationsCount(context);
  descriptors::signal::boost::Regular::MakeHandler();
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::signal((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
            *)local_58,(int)&local_59,(__sighandler_t)&local_5a);
  StorageArray<boost::signals2::scoped_connection>::StorageArray
            ((StorageArray<boost::signals2::scoped_connection> *)local_80,numSlots);
  op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
  StorageArray<boost::signals2::scoped_connection>::
  Construct<benchmarks::SignalBenchmarks<descriptors::signal::boost::Regular>::Invoke(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            ((StorageArray<boost::signals2::scoped_connection> *)local_80,
             (anon_class_16_2_8e986c60 *)
             &op.super___shared_ptr<benchmarks::IOperationProfiler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"invoke",(allocator *)((long)&i + 7));
  (*context->_vptr_BenchmarkContext[3])(local_a0,context,local_c0,numSlots * iVar1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  for (local_d0 = 0; __sig = (int)context, local_d0 < iVar1; local_d0 = local_d0 + 1) {
    boost::signals2::
    signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
    ::operator()((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
                  *)local_58);
  }
  std::shared_ptr<benchmarks::IOperationProfiler>::~shared_ptr
            ((shared_ptr<benchmarks::IOperationProfiler> *)local_a0);
  StorageArray<boost::signals2::scoped_connection>::Destruct
            ((StorageArray<boost::signals2::scoped_connection> *)local_80);
  StorageArray<boost::signals2::scoped_connection>::~StorageArray
            ((StorageArray<boost::signals2::scoped_connection> *)local_80);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::~signal((signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
             *)local_58,__sig,__handler);
  std::function<void_()>::~function((function<void_()> *)&s._pimpl.pn);
  return;
}

Assistant:

static void Invoke(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            SignalType s;
            StorageArray<ConnectionType> c(numSlots);

            c.Construct([&]{ return s.connect(handler); });

            {
                auto op = context.Profile("invoke", numSlots * n);
                for (int64_t i = 0; i < n; ++i)
                    s();
            }

            c.Destruct();
        }